

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase576::run(TestCase576 *this)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Builder builder_00;
  undefined4 uVar1;
  undefined8 uVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  StructSchema SVar9;
  ListElementCount LVar10;
  BuilderArena *arena;
  CapTableBuilder *capTable;
  ElementCount EVar11;
  Field field;
  Builder root;
  Orphan<capnproto_test::capnp::test::TestAllTypes> dstOrphan;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> dst;
  MallocMessageBuilder builder;
  undefined1 local_3e8 [24];
  WirePointer *pWStack_3d0;
  StructDataBitCount local_3c8;
  StructPointerCount SStack_3c4;
  undefined2 uStack_3c2;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  StructBuilder local_3a0;
  FieldList local_378;
  undefined1 in_stack_fffffffffffffcd0 [16];
  SegmentBuilder *in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce8 [16];
  OrphanBuilder local_288;
  StructBuilder local_268;
  Builder local_240;
  Builder local_210;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_378,&local_120.super_MessageBuilder);
  local_3e8._16_8_ = local_378.list.reader.capTable;
  local_3e8._0_8_ = local_378.parent.super_Schema.raw;
  local_3e8._8_8_ = local_378.list.reader.segment;
  PointerBuilder::initStruct(&local_3a0,(PointerBuilder *)local_3e8,(StructSize)0x140006);
  builder_00._builder.data = in_stack_fffffffffffffce0;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffcd0._0_8_;
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffcd0._8_8_;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffce8._0_8_;
  builder_00._builder.dataSize = in_stack_fffffffffffffce8._8_4_;
  builder_00._builder.pointerCount = in_stack_fffffffffffffce8._12_2_;
  builder_00._builder._38_2_ = in_stack_fffffffffffffce8._14_2_;
  initTestMessage(builder_00);
  local_3c8 = local_3a0.dataSize;
  SStack_3c4 = local_3a0.pointerCount;
  uStack_3c2 = local_3a0._38_2_;
  local_3e8._16_8_ = local_3a0.data;
  pWStack_3d0 = local_3a0.pointers;
  local_3e8._0_8_ = local_3a0.segment;
  local_3e8._8_8_ = local_3a0.capTable;
  arena = StructBuilder::getArena((StructBuilder *)local_3e8);
  capTable = StructBuilder::getCapTable((StructBuilder *)local_3e8);
  OrphanBuilder::initStruct((OrphanBuilder *)local_3e8,arena,capTable,(StructSize)0x140006);
  local_288.capTable = (CapTableBuilder *)local_3e8._16_8_;
  local_288.location = (word *)pWStack_3d0;
  local_288.tag.content = local_3e8._0_8_;
  local_288.segment = (SegmentBuilder *)local_3e8._8_8_;
  OrphanBuilder::asStruct(&local_268,&local_288,(StructSize)0x140006);
  local_240.builder.dataSize = local_3a0.dataSize;
  local_240.builder.pointerCount = local_3a0.pointerCount;
  local_240.builder._38_2_ = local_3a0._38_2_;
  local_240.builder.data = local_3a0.data;
  local_240.builder.pointers = local_3a0.pointers;
  local_240.builder.segment = local_3a0.segment;
  local_240.builder.capTable = local_3a0.capTable;
  local_240.schema.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  local_210.builder.dataSize = local_268.dataSize;
  local_210.builder.pointerCount = local_268.pointerCount;
  local_210.builder._38_2_ = local_268._38_2_;
  local_210.builder.data = local_268.data;
  local_210.builder.pointers = local_268.pointers;
  local_210.builder.segment = local_268.segment;
  local_210.builder.capTable = local_268.capTable;
  local_210.schema.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  local_3e8._0_8_ = (long)schemas::s_a0a8f314b80b63fd + 0x48;
  StructSchema::getFields(&local_378,(StructSchema *)local_3e8);
  LVar10 = local_378.list.reader.elementCount;
  if (local_378.list.reader.elementCount != 0) {
    EVar11 = 0;
    do {
      SVar9.super_Schema.raw = local_378.parent.super_Schema.raw;
      ListReader::getStructElement((StructReader *)(local_3e8 + 0x10),&local_378.list.reader,EVar11)
      ;
      uVar8 = uStack_3b0;
      uVar6 = local_3b8;
      uVar5 = uStack_3c0;
      uVar4 = _local_3c8;
      pWVar3 = pWStack_3d0;
      uVar2 = local_3e8._16_8_;
      local_3e8._0_8_ = SVar9.super_Schema.raw;
      uVar1 = local_3e8._12_4_;
      local_3e8._8_4_ = EVar11;
      field_00._8_8_ = local_3e8._8_8_;
      field_00.parent.super_Schema.raw = SVar9.super_Schema.raw;
      field_00.proto._reader.segment = (SegmentReader *)local_3e8._16_8_;
      field_00.proto._reader.capTable = (CapTableReader *)pWStack_3d0;
      field_00.proto._reader.data = (void *)_local_3c8;
      field_00.proto._reader.pointers = (WirePointer *)uStack_3c0;
      field_00.proto._reader.dataSize = (undefined4)local_3b8;
      field_00.proto._reader.pointerCount = local_3b8._4_2_;
      field_00.proto._reader._38_2_ = local_3b8._6_2_;
      field_00.proto._reader._40_8_ = uStack_3b0;
      DynamicStruct::Builder::disown
                ((Orphan<capnp::DynamicValue> *)&stack0xfffffffffffffcc0,&local_240,field_00);
      uVar7 = local_3b8;
      field_01._12_4_ = uVar1;
      field_01.index = EVar11;
      field_01.parent.super_Schema.raw = SVar9.super_Schema.raw;
      field_01.proto._reader.segment = (SegmentReader *)uVar2;
      field_01.proto._reader.capTable = (CapTableReader *)pWVar3;
      field_01.proto._reader.data = (void *)uVar4;
      field_01.proto._reader.pointers = (WirePointer *)uVar5;
      local_3b8._0_4_ = (undefined4)uVar6;
      local_3b8._4_2_ = SUB82(uVar6,4);
      local_3b8._6_2_ = SUB82(uVar6,6);
      field_01.proto._reader.dataSize = (undefined4)local_3b8;
      field_01.proto._reader.pointerCount = local_3b8._4_2_;
      field_01.proto._reader._38_2_ = local_3b8._6_2_;
      field_01.proto._reader._40_8_ = uVar8;
      local_3b8 = uVar7;
      DynamicStruct::Builder::adopt
                (&local_210,field_01,(Orphan<capnp::DynamicValue> *)&stack0xfffffffffffffcc0);
      if (in_stack_fffffffffffffce0 != (SegmentBuilder *)0x0) {
        OrphanBuilder::euthanize((OrphanBuilder *)&stack0xfffffffffffffcd8);
      }
      EVar11 = EVar11 + 1;
    } while (LVar10 != EVar11);
  }
  StructBuilder::asReader(&local_3a0);
  reader._reader.capTable = (CapTableReader *)uStack_148;
  reader._reader.segment = (SegmentReader *)local_150;
  reader._reader.data = (void *)local_140;
  reader._reader.pointers = (WirePointer *)uStack_138;
  reader._reader.dataSize = (undefined4)local_130;
  reader._reader.pointerCount = local_130._4_2_;
  reader._reader._38_2_ = local_130._6_2_;
  reader._reader._40_8_ = uStack_128;
  checkTestMessageAllZero(reader);
  StructBuilder::asReader(&local_268);
  reader_00._reader.capTable = (CapTableReader *)uStack_178;
  reader_00._reader.segment = (SegmentReader *)local_180;
  reader_00._reader.data = (void *)local_170;
  reader_00._reader.pointers = (WirePointer *)uStack_168;
  reader_00._reader.dataSize = (undefined4)local_160;
  reader_00._reader.pointerCount = local_160._4_2_;
  reader_00._reader._38_2_ = local_160._6_2_;
  reader_00._reader._40_8_ = uStack_158;
  checkTestMessage(reader_00);
  local_3e8._0_8_ = local_240.schema.super_Schema.raw;
  StructSchema::getFields(&local_378,(StructSchema *)local_3e8);
  if (local_378.list.reader.elementCount != 0) {
    EVar11 = 0;
    do {
      SVar9.super_Schema.raw = local_378.parent.super_Schema.raw;
      ListReader::getStructElement((StructReader *)(local_3e8 + 0x10),&local_378.list.reader,EVar11)
      ;
      uVar8 = uStack_3b0;
      uVar6 = local_3b8;
      uVar5 = uStack_3c0;
      uVar4 = _local_3c8;
      pWVar3 = pWStack_3d0;
      uVar2 = local_3e8._16_8_;
      local_3e8._0_8_ = SVar9.super_Schema.raw;
      uVar1 = local_3e8._12_4_;
      local_3e8._8_4_ = EVar11;
      field_02._8_8_ = local_3e8._8_8_;
      field_02.parent.super_Schema.raw = SVar9.super_Schema.raw;
      field_02.proto._reader.segment = (SegmentReader *)local_3e8._16_8_;
      field_02.proto._reader.capTable = (CapTableReader *)pWStack_3d0;
      field_02.proto._reader.data = (void *)_local_3c8;
      field_02.proto._reader.pointers = (WirePointer *)uStack_3c0;
      field_02.proto._reader.dataSize = (undefined4)local_3b8;
      field_02.proto._reader.pointerCount = local_3b8._4_2_;
      field_02.proto._reader._38_2_ = local_3b8._6_2_;
      field_02.proto._reader._40_8_ = uStack_3b0;
      DynamicStruct::Builder::disown
                ((Orphan<capnp::DynamicValue> *)&stack0xfffffffffffffcc0,&local_240,field_02);
      uVar7 = local_3b8;
      field_03._12_4_ = uVar1;
      field_03.index = EVar11;
      field_03.parent.super_Schema.raw = SVar9.super_Schema.raw;
      field_03.proto._reader.segment = (SegmentReader *)uVar2;
      field_03.proto._reader.capTable = (CapTableReader *)pWVar3;
      field_03.proto._reader.data = (void *)uVar4;
      field_03.proto._reader.pointers = (WirePointer *)uVar5;
      local_3b8._0_4_ = (undefined4)uVar6;
      local_3b8._4_2_ = SUB82(uVar6,4);
      local_3b8._6_2_ = SUB82(uVar6,6);
      field_03.proto._reader.dataSize = (undefined4)local_3b8;
      field_03.proto._reader.pointerCount = local_3b8._4_2_;
      field_03.proto._reader._38_2_ = local_3b8._6_2_;
      field_03.proto._reader._40_8_ = uVar8;
      local_3b8 = uVar7;
      DynamicStruct::Builder::adopt
                (&local_210,field_03,(Orphan<capnp::DynamicValue> *)&stack0xfffffffffffffcc0);
      if (in_stack_fffffffffffffce0 != (SegmentBuilder *)0x0) {
        OrphanBuilder::euthanize((OrphanBuilder *)&stack0xfffffffffffffcd8);
      }
      EVar11 = EVar11 + 1;
    } while (local_378.list.reader.elementCount != EVar11);
  }
  StructBuilder::asReader(&local_3a0);
  reader_01._reader.capTable = (CapTableReader *)uStack_1a8;
  reader_01._reader.segment = (SegmentReader *)local_1b0;
  reader_01._reader.data = (void *)local_1a0;
  reader_01._reader.pointers = (WirePointer *)uStack_198;
  reader_01._reader.dataSize = (undefined4)local_190;
  reader_01._reader.pointerCount = local_190._4_2_;
  reader_01._reader._38_2_ = local_190._6_2_;
  reader_01._reader._40_8_ = uStack_188;
  checkTestMessageAllZero(reader_01);
  StructBuilder::asReader(&local_268);
  reader_02._reader.capTable = (CapTableReader *)uStack_1d8;
  reader_02._reader.segment = (SegmentReader *)local_1e0;
  reader_02._reader.data = (void *)local_1d0;
  reader_02._reader.pointers = (WirePointer *)uStack_1c8;
  reader_02._reader.dataSize = (undefined4)local_1c0;
  reader_02._reader.pointerCount = local_1c0._4_2_;
  reader_02._reader._38_2_ = local_1c0._6_2_;
  reader_02._reader._40_8_ = uStack_1b8;
  checkTestMessageAllZero(reader_02);
  if (local_288.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_288);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, DynamicDisown) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();
  initTestMessage(root);

  Orphan<TestAllTypes> dstOrphan =
      Orphanage::getForMessageContaining(root).newOrphan<TestAllTypes>();
  auto dst = dstOrphan.get();

  DynamicStruct::Builder dynamic = root;
  DynamicStruct::Builder dynamicDst = dst;

  for (auto field: dynamic.getSchema().getFields()) {
    dynamicDst.adopt(field, dynamic.disown(field));
  }

  checkTestMessageAllZero(root.asReader());
  checkTestMessage(dst.asReader());

  for (auto field: dynamic.getSchema().getFields()) {
    dynamicDst.adopt(field, dynamic.disown(field));
  }

  checkTestMessageAllZero(root.asReader());
  checkTestMessageAllZero(dst.asReader());
}